

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall Eigen::internal::CacheSizes::CacheSizes(CacheSizes *this)

{
  ptrdiff_t pVar1;
  ptrdiff_t *in_RDI;
  int *in_stack_00000010;
  int l3CacheSize;
  int l2CacheSize;
  int l1CacheSize;
  int local_14;
  int local_10;
  int local_c;
  
  *in_RDI = -1;
  in_RDI[1] = -1;
  in_RDI[2] = -1;
  queryCacheSizes((int *)this,_l2CacheSize,in_stack_00000010);
  pVar1 = manage_caching_sizes_helper((long)local_c,0x8000);
  *in_RDI = pVar1;
  pVar1 = manage_caching_sizes_helper((long)local_10,0x40000);
  in_RDI[1] = pVar1;
  pVar1 = manage_caching_sizes_helper((long)local_14,0x200000);
  in_RDI[2] = pVar1;
  return;
}

Assistant:

CacheSizes(): m_l1(-1),m_l2(-1),m_l3(-1) {
    int l1CacheSize, l2CacheSize, l3CacheSize;
    queryCacheSizes(l1CacheSize, l2CacheSize, l3CacheSize);
    m_l1 = manage_caching_sizes_helper(l1CacheSize, defaultL1CacheSize);
    m_l2 = manage_caching_sizes_helper(l2CacheSize, defaultL2CacheSize);
    m_l3 = manage_caching_sizes_helper(l3CacheSize, defaultL3CacheSize);
  }